

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

float Rml::ComputeLength(NumericValue value,Element *element)

{
  bool bVar1;
  Units units;
  ComputedValues *pCVar2;
  float fVar3;
  Vector2i VStack_58;
  float result;
  Vector2<float> local_50;
  Context *local_48;
  Context *context_1;
  ElementDocument *document;
  Context *context;
  Vector2f vp_dimensions;
  float dp_ratio;
  float doc_font_size;
  float font_size;
  Element *element_local;
  NumericValue value_local;
  
  dp_ratio = 0.0;
  vp_dimensions.y = 0.0;
  vp_dimensions.x = 1.0;
  Vector2<float>::Vector2((Vector2<float> *)((long)&context + 4),1.0);
  element_local._4_4_ = value.unit;
  units = operator&(element_local._4_4_,DP_SCALABLE_LENGTH);
  bVar1 = Any(units);
  if ((bVar1) &&
     (document = (ElementDocument *)Element::GetContext(element), document != (ElementDocument *)0x0
     )) {
    vp_dimensions.x = Context::GetDensityIndependentPixelRatio((Context *)document);
  }
  if ((element_local._4_4_ == VW) || (element_local._4_4_ == VH)) {
    local_48 = Element::GetContext(element);
    if (local_48 != (Context *)0x0) {
      VStack_58 = Context::GetDimensions(local_48);
      local_50 = Vector2::operator_cast_to_Vector2((Vector2 *)&stack0xffffffffffffffa8);
      unique0x1000016e = local_50;
    }
  }
  else if (element_local._4_4_ == EM) {
    pCVar2 = Element::GetComputedValues(element);
    dp_ratio = Style::ComputedValues::font_size(pCVar2);
  }
  else if (element_local._4_4_ == REM) {
    context_1 = (Context *)Element::GetOwnerDocument(element);
    if ((ElementDocument *)context_1 == (ElementDocument *)0x0) {
      pCVar2 = DefaultComputedValues();
      vp_dimensions.y = Style::ComputedValues::font_size(pCVar2);
    }
    else {
      pCVar2 = Element::GetComputedValues((Element *)context_1);
      vp_dimensions.y = Style::ComputedValues::font_size(pCVar2);
    }
  }
  fVar3 = ComputeLength(value,dp_ratio,vp_dimensions.y,vp_dimensions.x,stack0xffffffffffffffd4);
  return fVar3;
}

Assistant:

static float ComputeLength(NumericValue value, Element* element)
{
	float font_size = 0.f;
	float doc_font_size = 0.f;
	float dp_ratio = 1.0f;
	Vector2f vp_dimensions(1.0f);

	if (Any(value.unit & Unit::DP_SCALABLE_LENGTH))
	{
		if (Context* context = element->GetContext())
			dp_ratio = context->GetDensityIndependentPixelRatio();
	}

	switch (value.unit)
	{
	case Unit::EM: font_size = element->GetComputedValues().font_size(); break;
	case Unit::REM:
		if (ElementDocument* document = element->GetOwnerDocument())
			doc_font_size = document->GetComputedValues().font_size();
		else
			doc_font_size = DefaultComputedValues().font_size();
		break;
	case Unit::VW:
	case Unit::VH:
		if (Context* context = element->GetContext())
			vp_dimensions = Vector2f(context->GetDimensions());
		break;
	default: break;
	}

	const float result = ComputeLength(value, font_size, doc_font_size, dp_ratio, vp_dimensions);
	return result;
}